

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractitemview.cpp
# Opt level: O0

bool __thiscall
QAbstractItemViewPrivate::shouldAutoScroll(QAbstractItemViewPrivate *this,QPoint *pos)

{
  long lVar1;
  int iVar2;
  int iVar3;
  long in_RDI;
  long in_FS_OFFSET;
  QRect area;
  bool local_39;
  bool local_19;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if ((*(byte *)(in_RDI + 0x418) & 1) == 0) {
    local_19 = false;
  }
  else {
    QWidgetPrivate::get((QWidget *)0x805466);
    QWidgetPrivate::clipRect((QWidgetPrivate *)&DAT_aaaaaaaaaaaaaaaa);
    iVar2 = QPoint::y((QPoint *)0x805482);
    iVar3 = QRect::top((QRect *)0x805490);
    local_39 = true;
    if (*(int *)(in_RDI + 0x420) <= iVar2 - iVar3) {
      iVar2 = QRect::bottom((QRect *)0x8054b7);
      iVar3 = QPoint::y((QPoint *)0x8054c5);
      local_39 = true;
      if (*(int *)(in_RDI + 0x420) <= iVar2 - iVar3) {
        iVar2 = QPoint::x((QPoint *)0x8054e8);
        iVar3 = QRect::left((QRect *)0x8054f6);
        local_39 = true;
        if (*(int *)(in_RDI + 0x420) <= iVar2 - iVar3) {
          iVar2 = QRect::right((QRect *)0x805519);
          iVar3 = QPoint::x((QPoint *)0x805527);
          local_39 = iVar2 - iVar3 < *(int *)(in_RDI + 0x420);
        }
      }
    }
    local_19 = local_39;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return local_19;
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractItemViewPrivate::shouldAutoScroll(const QPoint &pos) const
{
    if (!autoScroll)
        return false;
    const QRect area = QWidgetPrivate::get(viewport)->clipRect();
    return (pos.y() - area.top() < autoScrollMargin)
        || (area.bottom() - pos.y() < autoScrollMargin)
        || (pos.x() - area.left() < autoScrollMargin)
        || (area.right() - pos.x() < autoScrollMargin);
}